

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<24u,unsigned_char,void,false>::wr_string<char*>
          (uintwide_t<24u,unsigned_char,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  byte *pbVar1;
  value_type_conflict4 vVar2;
  byte bVar3;
  byte abVar4 [2];
  byte abVar5 [2];
  long lVar6;
  unsigned_fast_type uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  byte bVar15;
  ushort uVar16;
  bool bVar17;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  uintwide_t<24U,_unsigned_char,_void,_false> local_54;
  byte local_50 [2];
  uintwide_t<24u,unsigned_char,void,false> local_4e;
  byte local_4c [2];
  uintwide_t<24u,unsigned_char,void,false> local_4a;
  byte local_48 [20];
  value_type_conflict4 local_34 [2];
  uintwide_t<24u,unsigned_char,void,false> local_32;
  
  iVar12 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar12 == 0x10) {
    local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)this[2];
    local_54.values.super_array<unsigned_char,_3UL>.elems._0_2_ = *(undefined2 *)this;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    lVar6 = 0;
    do {
      vVar2 = local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6];
      if (vVar2 != '\0') break;
      bVar17 = lVar6 != 2;
      lVar6 = lVar6 + 1;
    } while (bVar17);
    if (vVar2 == '\0') {
      local_48[0xc] = 0x30;
      uVar8 = 0xc;
    }
    else {
      uVar7 = uintwide_t<24U,_unsigned_char,_void,_false>::extract_hex_digits<false,_nullptr>
                        (&local_54,(char *)(local_48 + 0xd),is_uppercase);
      uVar8 = 0xd - uVar7;
    }
    if ((show_base) && (1 < (long)uVar8)) {
      local_48[(int)uVar8 - 1] = !is_uppercase << 5 | 0x58;
      uVar8 = uVar8 - 2;
      local_48[uVar8 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar8)) {
      uVar8 = uVar8 - 1;
      local_48[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar6 = 0;
      if (field_width < 0xe) {
        lVar6 = 0xd - field_width;
      }
      while (lVar6 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        local_48[uVar8 & 0xffffffff] = fill_char_str;
      }
    }
    local_48[0xd] = 0;
    lVar6 = 0;
    do {
      bVar15 = local_48[lVar6 + uVar8];
      str_result[lVar6] = bVar15;
      lVar6 = lVar6 + 1;
    } while (bVar15 != 0);
  }
  else if (iVar12 == 10) {
    local_4e = this[2];
    local_50 = (byte  [2])*(undefined2 *)this;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0xe] = 0;
    local_48[0xf] = 0;
    lVar6 = 0;
    do {
      pbVar1 = local_50 + lVar6;
      if (*pbVar1 != 0) break;
      bVar17 = lVar6 != 2;
      lVar6 = lVar6 + 1;
    } while (bVar17);
    if (*pbVar1 != 0) {
      uVar8 = 0x10;
      do {
        local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)local_4e;
        abVar4 = local_50;
        lVar6 = 0;
        do {
          pbVar1 = local_50 + lVar6;
          if (*pbVar1 != 0) break;
          bVar17 = lVar6 != 2;
          lVar6 = lVar6 + 1;
        } while (bVar17);
        if ((uVar8 == 0) || (*pbVar1 == 0)) goto LAB_00146065;
        local_32 = local_4e;
        local_34[0] = local_50[0];
        local_34[1] = local_50[1];
        lVar6 = 2;
        uVar13 = 0;
        uVar14 = 0;
        do {
          uVar13 = (uVar14 + uVar13 * 0xf6) * 0x100;
          uVar14 = uVar13 | local_50[lVar6];
          uVar13 = (uVar13 & 0xffff | (uint)local_50[lVar6]) / 10;
          local_50[lVar6] = (byte)uVar13;
          abVar5 = local_50;
          bVar17 = lVar6 != 0;
          lVar6 = lVar6 + -1;
        } while (bVar17);
        local_4a = local_4e;
        local_4c[0] = local_50[0];
        local_4c[1] = local_50[1];
        lVar6 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + (uint)local_4c[lVar6] * 10;
          local_4c[lVar6] = (byte)uVar14;
          uVar14 = uVar14 >> 8;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_50[0] = abVar4[0];
        local_50[1] = abVar4[1];
        local_54.values.super_array<unsigned_char,_3UL>.elems[0] = local_50[0];
        local_54.values.super_array<unsigned_char,_3UL>.elems[1] = local_50[1];
        lVar6 = 0;
        uVar11 = 0;
        do {
          uVar16 = (local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6] - uVar11) -
                   (ushort)local_4c[lVar6];
          uVar11 = (ushort)(0xff < uVar16);
          local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6] =
               (value_type_conflict4)uVar16;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_48[uVar8 - 1 & 0xffffffff] =
             local_54.values.super_array<unsigned_char,_3UL>.elems[0] + 0x30;
        uVar8 = uVar8 - 1;
        local_50 = abVar5;
      } while( true );
    }
    local_48[0xf] = 0x30;
    uVar8 = 0xf;
LAB_00146065:
    if (show_pos && 0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      local_48[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar6 = 0;
      if (field_width < 0x11) {
        lVar6 = 0x10 - field_width;
      }
      while (lVar6 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        local_48[uVar8 & 0xffffffff] = fill_char_str;
      }
    }
    local_48[0x10] = 0;
    lVar6 = 0;
    do {
      bVar15 = local_48[lVar6 + uVar8];
      str_result[lVar6] = bVar15;
      lVar6 = lVar6 + 1;
    } while (bVar15 != 0);
  }
  else {
    if (iVar12 != 8) {
      return false;
    }
    local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)this[2];
    local_54.values.super_array<unsigned_char,_3UL>.elems._0_2_ = *(undefined2 *)this;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0xe] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    lVar6 = 0;
    do {
      vVar2 = local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6];
      if (vVar2 != '\0') break;
      bVar17 = lVar6 != 2;
      lVar6 = lVar6 + 1;
    } while (bVar17);
    if (vVar2 != '\0') {
      uVar8 = 0xf;
      do {
        lVar6 = 0;
        do {
          vVar2 = local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6];
          if (vVar2 != '\0') break;
          bVar17 = lVar6 != 2;
          lVar6 = lVar6 + 1;
        } while (bVar17);
        uVar10 = uVar8 - 1;
        if ((uVar8 == 0) || (vVar2 == '\0')) goto LAB_0014615a;
        local_48[uVar10 & 0xffffffff] =
             local_54.values.super_array<unsigned_char,_3UL>.elems[0] & 7 | 0x30;
        lVar6 = 2;
        bVar15 = 0;
        do {
          bVar3 = local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6];
          local_54.values.super_array<unsigned_char,_3UL>.elems[lVar6] = bVar3 >> 3 | bVar15;
          bVar15 = bVar3 << 5;
          bVar17 = lVar6 != 0;
          lVar6 = lVar6 + -1;
          uVar8 = uVar10;
        } while (bVar17);
      } while( true );
    }
    local_48[0xe] = 0x30;
    uVar8 = 0xe;
LAB_0014615a:
    if (show_base && 0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      local_48[uVar8 & 0xffffffff] = 0x30;
    }
    if (show_pos && 0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      local_48[uVar8 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      uVar10 = 0xf;
      if (field_width < 0xf) {
        uVar10 = field_width;
      }
      uVar9 = uVar8;
      while ((long)(uVar10 ^ 0xf) < (long)uVar9) {
        uVar9 = uVar9 - 1;
        local_48[uVar9 & 0xffffffff] = fill_char_str;
        uVar8 = uVar10 ^ 0xf;
      }
    }
    local_48[0xf] = 0;
    lVar6 = 0;
    do {
      bVar15 = local_48[lVar6 + uVar8];
      str_result[lVar6] = bVar15;
      lVar6 = lVar6 + 1;
    } while (bVar15 != 0);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }